

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O2

void llvm::cl::
     apply<llvm::cl::opt<(anonymous_namespace)::HelpPrinter,true,llvm::cl::parser<bool>>,llvm::cl::desc,llvm::cl::LocationClass<(anonymous_namespace)::HelpPrinter>,llvm::cl::OptionHidden,llvm::cl::ValueExpected,llvm::cl::cat,llvm::cl::sub>
               (opt<(anonymous_namespace)::HelpPrinter,_true,_llvm::cl::parser<bool>_> *O,desc *M,
               LocationClass<(anonymous_namespace)::HelpPrinter> *Ms,OptionHidden *Ms_1,
               ValueExpected *Ms_2,cat *Ms_3,sub *Ms_4)

{
  size_t sVar1;
  ushort uVar2;
  ushort uVar3;
  raw_ostream *Errs;
  Twine TStack_48;
  
  sVar1 = (M->Desc).Length;
  (O->super_Option).HelpStr.Data = (M->Desc).Data;
  (O->super_Option).HelpStr.Length = sVar1;
  if ((O->super_opt_storage<(anonymous_namespace)::HelpPrinter,_true,_true>).Location ==
      (HelpPrinter *)0x0) {
    (O->super_opt_storage<(anonymous_namespace)::HelpPrinter,_true,_true>).Location = Ms->Loc;
  }
  else {
    Twine::Twine(&TStack_48,"cl::location(x) specified more than once!");
    Errs = errs();
    Option::error(&O->super_Option,&TStack_48,(StringRef)ZEXT816(0),Errs);
  }
  uVar3 = (ushort)*(undefined4 *)&(O->super_Option).field_0xc;
  uVar2 = (ushort)((*Ms_1 & (ReallyHidden|Hidden)) << 5);
  *(ushort *)&(O->super_Option).field_0xc = uVar3 & 0xff9f | uVar2;
  *(ushort *)&(O->super_Option).field_0xc = (uVar3 & 0xff87 | uVar2) + ((ushort)*Ms_2 & 3) * 8;
  (O->super_Option).Category = Ms_3->Category;
  Option::addSubCommand(&O->super_Option,Ms_4->Sub);
  return;
}

Assistant:

void apply(Opt *O, const Mod &M, const Mods &... Ms) {
  applicator<Mod>::opt(M, *O);
  apply(O, Ms...);
}